

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsx-impl.inc.c
# Opt level: O0

void gen_xsxexpqp(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx_00;
  uint32_t uVar1;
  TCGv_i64 ret;
  TCGv_i64 ret_00;
  TCGv_i64 dst;
  TCGv_i64 xbh;
  TCGv_i64 xtl;
  TCGv_i64 xth;
  TCGContext_conflict10 *tcg_ctx;
  DisasContext_conflict10 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  if (((ctx->vsx_enabled ^ 0xffU) & 1) == 0) {
    ret = tcg_temp_new_i64(tcg_ctx_00);
    ret_00 = tcg_temp_new_i64(tcg_ctx_00);
    dst = tcg_temp_new_i64(tcg_ctx_00);
    uVar1 = rB(ctx->opcode);
    get_cpu_vsrh(tcg_ctx_00,dst,uVar1 + 0x20);
    tcg_gen_extract_i64_ppc64(tcg_ctx_00,ret,dst,0x30,0xf);
    uVar1 = rD(ctx->opcode);
    set_cpu_vsrh(tcg_ctx_00,uVar1 + 0x20,ret);
    tcg_gen_movi_i64_ppc64(tcg_ctx_00,ret_00,0);
    uVar1 = rD(ctx->opcode);
    set_cpu_vsrl(tcg_ctx_00,uVar1 + 0x20,ret_00);
    tcg_temp_free_i64(tcg_ctx_00,dst);
    tcg_temp_free_i64(tcg_ctx_00,ret);
    tcg_temp_free_i64(tcg_ctx_00,ret_00);
  }
  else {
    gen_exception(ctx,0x5e);
  }
  return;
}

Assistant:

static void gen_xsxexpqp(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv_i64 xth;
    TCGv_i64 xtl;
    TCGv_i64 xbh;

    if (unlikely(!ctx->vsx_enabled)) {
        gen_exception(ctx, POWERPC_EXCP_VSXU);
        return;
    }
    xth = tcg_temp_new_i64(tcg_ctx);
    xtl = tcg_temp_new_i64(tcg_ctx);
    xbh = tcg_temp_new_i64(tcg_ctx);
    get_cpu_vsrh(tcg_ctx, xbh, rB(ctx->opcode) + 32);

    tcg_gen_extract_i64(tcg_ctx, xth, xbh, 48, 15);
    set_cpu_vsrh(tcg_ctx, rD(ctx->opcode) + 32, xth);
    tcg_gen_movi_i64(tcg_ctx, xtl, 0);
    set_cpu_vsrl(tcg_ctx, rD(ctx->opcode) + 32, xtl);

    tcg_temp_free_i64(tcg_ctx, xbh);
    tcg_temp_free_i64(tcg_ctx, xth);
    tcg_temp_free_i64(tcg_ctx, xtl);
}